

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

void __thiscall
Js::JavascriptRegExp::JavascriptRegExp
          (JavascriptRegExp *this,JavascriptRegExp *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,&instance->super_DynamicObject,deepCopy);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013ccf50;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet
            (&this->pattern,(instance->pattern).ptr);
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet
            (&this->splitPattern,(instance->splitPattern).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->lastIndexVar,&instance->lastIndexVar);
  this->lastIndexOrFlag = instance->lastIndexOrFlag;
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x42,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) goto LAB_00bafa2b;
    *puVar3 = 0;
  }
  bVar2 = ThreadContext::IsOnStack((instance->pattern).ptr);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x45,"(!ThreadContext::IsOnStack(instance->GetPattern()))",
                                "!ThreadContext::IsOnStack(instance->GetPattern())");
    if (!bVar2) goto LAB_00bafa2b;
    *puVar3 = 0;
  }
  bVar2 = ThreadContext::IsOnStack((instance->splitPattern).ptr);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x46,"(!ThreadContext::IsOnStack(instance->GetSplitPattern()))",
                                "!ThreadContext::IsOnStack(instance->GetSplitPattern())");
    if (!bVar2) goto LAB_00bafa2b;
    *puVar3 = 0;
  }
  bVar2 = ThreadContext::IsOnStack((instance->lastIndexVar).ptr);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x47,"(!ThreadContext::IsOnStack(instance->lastIndexVar))",
                                "!ThreadContext::IsOnStack(instance->lastIndexVar)");
    if (!bVar2) {
LAB_00bafa2b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

JavascriptRegExp::JavascriptRegExp(JavascriptRegExp * instance, bool deepCopy) :
        DynamicObject(instance, deepCopy),
        pattern(instance->GetPattern()),
        splitPattern(instance->GetSplitPattern()),
        lastIndexVar(instance->lastIndexVar),
        lastIndexOrFlag(instance->lastIndexOrFlag)
    {
        // For boxing stack instance
        Assert(ThreadContext::IsOnStack(instance));

        // These members should never be on the stack and thus never need to be deep copied
        Assert(!ThreadContext::IsOnStack(instance->GetPattern()));
        Assert(!ThreadContext::IsOnStack(instance->GetSplitPattern()));
        Assert(!ThreadContext::IsOnStack(instance->lastIndexVar));
    }